

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_vector.h
# Opt level: O1

gc_table * __thiscall
mjs::gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::tab
          (gc_vector<mjs::(anonymous_namespace)::string_cache::entry> *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  gc_heap *pgVar4;
  slot *psVar5;
  uint uVar6;
  
  pgVar4 = this->heap_;
  uVar1 = (this->table_).pos_;
  uVar6 = uVar1 - 1;
  uVar2 = (pgVar4->alloc_context_).start_;
  if ((uVar2 <= uVar6) && (uVar3 = (pgVar4->alloc_context_).next_free_, uVar6 < uVar3)) {
    psVar5 = (pgVar4->alloc_context_).storage_;
    if (gc_type_info_registration<mjs::gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::gc_table>
        ::reg._40_4_ != *(int *)((long)psVar5 + (ulong)uVar6 * 8 + 4)) {
      __assert_fail("h.type_check<T>(pos_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h"
                    ,0x1db,
                    "T &mjs::gc_heap_ptr_untracked<mjs::gc_vector<mjs::(anonymous namespace)::string_cache::entry>::gc_table>::dereference(gc_heap &) const [T = mjs::gc_vector<mjs::(anonymous namespace)::string_cache::entry>::gc_table, strong = true]"
                   );
    }
    if ((uVar2 <= uVar1) && (uVar1 < uVar3)) {
      return (gc_table *)(psVar5 + uVar1);
    }
  }
  __assert_fail("pos_inside(pos)",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                0x13a,"slot *mjs::gc_heap::allocation_context::get_at(uint32_t) const");
}

Assistant:

gc_table& tab() const { return table_.dereference(heap_); }